

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::nextOffBit
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *fromIndex)

{
  int iVar1;
  pointer piVar2;
  int i;
  long lVar3;
  value_type_conflict1 *__val;
  long lVar4;
  
  piVar2 = (pointer)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar2;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar2 + 6;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar2 + 6;
  lVar4 = 0;
  lVar3 = 0;
  do {
    iVar1 = OpenMDBitSet::nextOffBit
                      ((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar4),
                       (fromIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar3]);
    piVar2[lVar3] = iVar1;
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x28;
  } while (lVar3 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::nextOffBit(std::vector<int> fromIndex) const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].nextOffBit(fromIndex[i]);
    return result;
  }